

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O0

double inform_shannon_re(inform_dist *p,inform_dist *q,double base)

{
  uint64_t uVar1;
  _Bool _Var2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double v;
  double u;
  size_t i;
  double re;
  double base_local;
  inform_dist *q_local;
  inform_dist *p_local;
  
  _Var2 = inform_dist_is_valid(p);
  if (((_Var2) && (_Var2 = inform_dist_is_valid(q), _Var2)) && (p->size == q->size)) {
    i = 0;
    for (u = 0.0; (ulong)u < p->size; u = (double)((long)u + 1)) {
      if ((p->histogram[(long)u] == 0) || (q->histogram[(long)u] == 0)) {
        if ((p->histogram[(long)u] != 0) && (q->histogram[(long)u] == 0)) {
          return NAN;
        }
      }
      else {
        uVar1 = p->counts;
        auVar5._8_4_ = (int)(uVar1 >> 0x20);
        auVar5._0_8_ = uVar1;
        auVar5._12_4_ = 0x45300000;
        dVar3 = (double)p->histogram[(long)u] /
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        uVar1 = q->counts;
        auVar6._8_4_ = (int)(uVar1 >> 0x20);
        auVar6._0_8_ = uVar1;
        auVar6._12_4_ = 0x45300000;
        dVar4 = log2(dVar3 / ((double)q->histogram[(long)u] /
                             ((auVar6._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))));
        i = (size_t)(dVar3 * dVar4 + (double)i);
      }
    }
    dVar3 = log2(base);
    p_local = (inform_dist *)((double)i / dVar3);
  }
  else {
    p_local = (inform_dist *)0x7ff8000000000000;
  }
  return (double)p_local;
}

Assistant:

double inform_shannon_re(inform_dist const *p, inform_dist const *q,
    double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double re = 0.;
        for (size_t i = 0; i < p->size; ++i)
        {
            if (p->histogram[i] != 0 && q->histogram[i] != 0)
            {
                double u = (double) p->histogram[i] / p->counts;
                double v = (double) q->histogram[i] / q->counts;
                re += u * log2(u / v);
            }
            else if (p->histogram[i] != 0 && q->histogram[i] == 0)
            {
                return NAN;
            }
        }
        return re / log2(base);
    }
    return NAN;
}